

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

String * kj::_::operator*(String *__return_storage_ptr__,long param_2,undefined8 param_3,
                         undefined8 param_4,StringPtr *param_5)

{
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  
  local_30 = (ArrayPtr<const_char>)Stringifier::operator*((Stringifier *)&STR,*(bool *)param_2);
  local_40 = (ArrayPtr<const_char>)
             Stringifier::operator*((Stringifier *)&STR,*(bool *)(param_2 + 1));
  concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
            (__return_storage_ptr__,(_ *)&local_30,(StringPtr *)(param_2 + 8),(StringPtr *)&local_40
             ,param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}